

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_RangeInt_Test::TestBody(TApp_RangeInt_Test *this)

{
  App *this_00;
  input_t *piVar1;
  bool bVar2;
  Option *pOVar3;
  AssertHelper local_b0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8 [4];
  undefined1 local_88 [4];
  int x;
  string local_80;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  x = 0;
  std::__cxx11::string::string((string *)&local_60,"--one",(allocator *)local_a8);
  std::__cxx11::string::string((string *)&local_80,"",(allocator *)&local_b0);
  this_00 = &(this->super_TApp).app;
  pOVar3 = CLI::App::add_option<int,_(CLI::detail::enabler)0>(this_00,&local_60,&x,&local_80);
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = (void *)0x600000003;
  local_28 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
             ::_M_invoke;
  local_30 = CLI::std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/Validators.hpp:65:12)>
             ::_M_manager;
  std::
  vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
  ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string_const&)>&>
            ((vector<std::function<std::__cxx11::string(std::__cxx11::string&)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string&)>>>
              *)&pOVar3->validators_,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_40);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)local_a8,"--one=1",(allocator *)&local_b0);
  piVar1 = &(this->super_TApp).args;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_a8,
             local_88);
  std::__cxx11::string::~string((string *)local_a8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x49c,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_a8);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_a8,"--one=7",(allocator *)&local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_a8,
             local_88);
  std::__cxx11::string::~string((string *)local_a8);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x4a0,
             "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_b0,(Message *)local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(local_a8);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_a8,"--one=3",(allocator *)&local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_a8,
             local_88);
  std::__cxx11::string::~string((string *)local_a8);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_a8,"--one=5",(allocator *)&local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_a8,
             local_88);
  std::__cxx11::string::~string((string *)local_a8);
  TApp::run(&this->super_TApp);
  CLI::App::reset(this_00);
  std::__cxx11::string::string((string *)local_a8,"--one=6",(allocator *)&local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)piVar1,local_a8,
             local_88);
  std::__cxx11::string::~string((string *)local_a8);
  TApp::run(&this->super_TApp);
  return;
}

Assistant:

TEST_F(TApp, RangeInt) {
    int x = 0;
    app.add_option("--one", x)->check(CLI::Range(3, 6));

    args = {"--one=1"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=7"};
    EXPECT_THROW(run(), CLI::ValidationError);

    app.reset();
    args = {"--one=3"};
    run();

    app.reset();
    args = {"--one=5"};
    run();

    app.reset();
    args = {"--one=6"};
    run();
}